

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sidebar.c
# Opt level: O3

void draw_sidebar_divider(void)

{
  wchar_t in_EAX;
  attr_t attrs;
  wchar_t n;
  wchar_t invheight;
  wchar_t flheight;
  wchar_t local_18;
  wchar_t local_14;
  
  if ((flooritems != (nh_objitem_conflict *)0x0) && (inventory != (nh_objitem_conflict *)0x0)) {
    local_18 = in_EAX;
    split_sidebar(&local_18,&local_14);
    if (sidebar == (WINDOW *)0x0) {
      n = L'\xffffffff';
    }
    else {
      n = sidebar->_maxx + L'\x01';
    }
    attrs = frame_hp_color();
    nh_box_mvwhline((WINDOW_conflict *)sidebar,local_18,L'\0',n,attrs);
    return;
  }
  return;
}

Assistant:

void draw_sidebar_divider(void)
{
    int invheight, flheight, sbwidth;
    attr_t frame_attr;

    if (!flooritems || !inventory)
	return;

    split_sidebar(&invheight, &flheight);
    sbwidth = getmaxx(sidebar);

    frame_attr = frame_hp_color();
    nh_box_mvwhline(sidebar, invheight, 0, sbwidth, frame_attr);
}